

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall
el::base::TypedConfigurations::insertFile
          (TypedConfigurations *this,Level level,string *fullFilename)

{
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var1;
  ostream *poVar2;
  char *pcVar3;
  iterator iVar4;
  fstream_t *__p;
  __shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var5;
  undefined4 in_register_00000034;
  Level local_bc;
  __shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_b8;
  string resolvedFilename;
  undefined1 local_80 [8];
  element_type *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_70 [2];
  string filePath;
  
  resolveFilename(&resolvedFilename,(TypedConfigurations *)CONCAT44(in_register_00000034,level),
                  fullFilename);
  if (resolvedFilename._M_string_length == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Could not load empty file for logging, please re-check your configurations for level ["
                            );
    pcVar3 = LevelHelper::convertToString(level);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"]");
  }
  utils::File::extractPathFromFilename(&filePath,&resolvedFilename,"/");
  if (filePath._M_string_length < resolvedFilename._M_string_length) {
    utils::File::createPath(&filePath);
  }
  if ((this->m_fileStreamMap)._M_h._M_element_count == 0 &&
      (this->m_filenameMap)._M_h._M_element_count == 0) {
    level = Global;
  }
  local_bc = level;
  iVar4 = utils::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->m_logStreamsReference->_M_h,&resolvedFilename);
  local_80._0_4_ = level;
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    __p = utils::File::newFileStream(&resolvedFilename);
    std::__cxx11::string::string((string *)&local_78,(string *)&resolvedFilename);
    std::
    _Hashtable<el::Level,std::pair<el::Level_const,std::__cxx11::string>,std::allocator<std::pair<el::Level_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<el::Level,std::__cxx11::string>>
              ((_Hashtable<el::Level,std::pair<el::Level_const,std::__cxx11::string>,std::allocator<std::pair<el::Level_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->m_filenameMap,local_80);
    std::__cxx11::string::~string((string *)&local_78);
    std::__shared_ptr<std::fstream,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<std::fstream,void>
              ((__shared_ptr<std::fstream,(__gnu_cxx::_Lock_policy)2> *)&local_b8,__p);
    local_78 = local_b8._M_ptr;
    aaStack_70[0]._M_allocated_capacity = local_b8._M_refcount._M_pi;
    local_b8._M_ptr = (element_type *)0x0;
    local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_80._0_4_ = level;
    std::
    _Hashtable<el::Level,std::pair<el::Level_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<el::Level_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<el::Level,std::shared_ptr<std::fstream>>>
              ((_Hashtable<el::Level,std::pair<el::Level_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<el::Level_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->m_fileStreamMap,local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aaStack_70[0]._M_allocated_capacity);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_refcount);
    p_Var1 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this->m_logStreamsReference;
    p_Var5 = &utils::std::__detail::
              _Map_base<el::Level,_std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<el::Level,_std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&this->m_fileStreamMap,&local_bc)->
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
    utils::std::
    __shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_b8,p_Var5);
    utils::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>
                *)local_80,&resolvedFilename,
               (shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)&local_b8);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<std::fstream>>>(p_Var1,local_80);
    utils::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>
             *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_refcount);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_78,
               (string *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
                      ._M_cur + 8));
    std::
    _Hashtable<el::Level,std::pair<el::Level_const,std::__cxx11::string>,std::allocator<std::pair<el::Level_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<el::Level,std::__cxx11::string>>
              ((_Hashtable<el::Level,std::pair<el::Level_const,std::__cxx11::string>,std::allocator<std::pair<el::Level_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->m_filenameMap,local_80);
    std::__cxx11::string::~string((string *)&local_78);
    utils::std::
    __shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_b8,
                 (__shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
                           ._M_cur + 0x28));
    local_78 = local_b8._M_ptr;
    aaStack_70[0]._M_allocated_capacity = local_b8._M_refcount._M_pi;
    local_b8._M_ptr = (element_type *)0x0;
    local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_80._0_4_ = level;
    std::
    _Hashtable<el::Level,std::pair<el::Level_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<el::Level_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<el::Level,std::shared_ptr<std::fstream>>>
              ((_Hashtable<el::Level,std::pair<el::Level_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<el::Level_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->m_fileStreamMap,local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aaStack_70[0]._M_allocated_capacity);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_refcount);
    __p = ((__shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
            *)((long)iVar4.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
                     ._M_cur + 0x28))->_M_ptr;
  }
  if (__p == (fstream_t *)0x0) {
    local_80._0_4_ = local_80._0_4_ & ~(Info|Verbose|Warning|Error|Fatal|Debug|Trace|Global);
    setValue<bool>(this,local_bc,(bool *)local_80,&this->m_toFileMap,true);
  }
  std::__cxx11::string::~string((string *)&filePath);
  std::__cxx11::string::~string((string *)&resolvedFilename);
  return;
}

Assistant:

void TypedConfigurations::insertFile(Level level, const std::string& fullFilename) {
  std::string resolvedFilename = resolveFilename(fullFilename);
  if (resolvedFilename.empty()) {
    std::cerr << "Could not load empty file for logging, please re-check your configurations for level ["
              << LevelHelper::convertToString(level) << "]";
  }
  std::string filePath = base::utils::File::extractPathFromFilename(resolvedFilename, base::consts::kFilePathSeperator);
  if (filePath.size() < resolvedFilename.size()) {
    base::utils::File::createPath(filePath);
  }
  auto create = [&](Level level) {
    base::LogStreamsReferenceMap::iterator filestreamIter = m_logStreamsReference->find(resolvedFilename);
    base::type::fstream_t* fs = nullptr;
    if (filestreamIter == m_logStreamsReference->end()) {
      // We need a completely new stream, nothing to share with
      fs = base::utils::File::newFileStream(resolvedFilename);
      m_filenameMap.insert(std::make_pair(level, resolvedFilename));
      m_fileStreamMap.insert(std::make_pair(level, base::FileStreamPtr(fs)));
      m_logStreamsReference->insert(std::make_pair(resolvedFilename, base::FileStreamPtr(m_fileStreamMap.at(level))));
    } else {
      // Woops! we have an existing one, share it!
      m_filenameMap.insert(std::make_pair(level, filestreamIter->first));
      m_fileStreamMap.insert(std::make_pair(level, base::FileStreamPtr(filestreamIter->second)));
      fs = filestreamIter->second.get();
    }
    if (fs == nullptr) {
      // We display bad file error from newFileStream()
      ELPP_INTERNAL_ERROR("Setting [TO_FILE] of ["
                          << LevelHelper::convertToString(level) << "] to FALSE", false);
      setValue(level, false, &m_toFileMap);
    }
  };
  // If we dont have file conf for any level, create it for Level::Global first
  // otherwise create for specified level
  create(m_filenameMap.empty() && m_fileStreamMap.empty() ? Level::Global : level);
}